

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

shared_ptr<tf::ChromeObserver> __thiscall
tf::Executor::make_observer<tf::ChromeObserver>(Executor *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar5;
  long in_RSI;
  size_type __new_size;
  pair<std::__detail::_Node_iterator<std::shared_ptr<tf::ObserverInterface>,_true,_false>,_bool>
  pVar6;
  shared_ptr<tf::ChromeObserver> sVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00158ca0;
  local_38 = p_Var2 + 1;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChromeObserver_00158cf0;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  p_Var2[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[2]._M_use_count = 0;
  p_Var2[2]._M_weak_count = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[3]._M_weak_count = 0;
  p_Var2[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[4]._M_use_count = 0;
  p_Var2[4]._M_weak_count = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)&(this->_taskflows_mutex).super___mutex_base._M_mutex + 8) = p_Var2;
  (this->_taskflows_mutex).super___mutex_base._M_mutex.__align = (long)local_38;
  lVar5 = *(long *)(in_RSI + 0x28);
  lVar1 = *(long *)(in_RSI + 0x30);
  __new_size = (lVar1 - lVar5 >> 7) * -0x79435e50d79435e5;
  std::
  vector<std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>,_std::allocator<std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>_>_>
  ::resize((vector<std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>,_std::allocator<std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>_>_>
            *)(p_Var2 + 2),__new_size);
  std::
  vector<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
  ::resize((vector<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
            *)&p_Var2[3]._M_use_count,__new_size);
  if (lVar1 != lVar5) {
    lVar5 = 0;
    do {
      std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>::
      reserve((vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_> *)
              ((long)&(((((_Vector_base<std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>,_std::allocator<std::vector<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>_>_>
                           *)&p_Var2[2]._vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data.
                       _M_start)->
                      super__Vector_base<tf::ChromeObserver::Segment,_std::allocator<tf::ChromeObserver::Segment>_>
                      )._M_impl.super__Vector_impl_data + lVar5),0x20);
      lVar5 = lVar5 + 0x18;
      __new_size = __new_size - 1;
    } while (__new_size != 0);
  }
  uVar3 = std::chrono::_V2::steady_clock::now();
  p_Var2[1]._M_use_count = (int)uVar3;
  p_Var2[1]._M_weak_count = (int)((ulong)uVar3 >> 0x20);
  local_48 = local_38;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
  }
  local_40 = p_Var2;
  pVar6 = std::
          _Hashtable<std::shared_ptr<tf::ObserverInterface>,std::shared_ptr<tf::ObserverInterface>,std::allocator<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<std::shared_ptr<tf::ObserverInterface>>
                    ((_Hashtable<std::shared_ptr<tf::ObserverInterface>,std::shared_ptr<tf::ObserverInterface>,std::allocator<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)(in_RSI + 0x100),&local_48);
  _Var4._M_pi = pVar6._8_8_;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    _Var4._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar7.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tf::ChromeObserver>)
         sVar7.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Observer> Executor::make_observer(ArgsT&&... args) {

  static_assert(
    std::is_base_of_v<ObserverInterface, Observer>,
    "Observer must be derived from ObserverInterface"
  );

  // use a local variable to mimic the constructor
  auto ptr = std::make_shared<Observer>(std::forward<ArgsT>(args)...);

  ptr->set_up(_workers.size());

  _observers.emplace(std::static_pointer_cast<ObserverInterface>(ptr));

  return ptr;
}